

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O0

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<int> *bVal)

{
  char *pcVar1;
  ChStreamOutAscii *pCVar2;
  int *piVar3;
  ChNameValue<int> *bVal_local;
  ChArchiveAsciiDump *this_local;
  
  indent(this);
  if ((this->suppress_names & 1U) == 0) {
    pCVar2 = this->ostream;
    pcVar1 = ChNameValue<int>::name(bVal);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,pcVar1);
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t");
  }
  pCVar2 = this->ostream;
  piVar3 = ChNameValue<int>::value(bVal);
  chrono::ChStreamOutAscii::operator<<(pCVar2,*piVar3);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<int> bVal) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }